

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int request_contains_shutdown_token(http_s *request)

{
  int iVar1;
  size_t sVar2;
  FIOBJ FVar3;
  char *__s2;
  fio_str_info_s local_40;
  FIOBJ local_28;
  FIOBJ key;
  http_s *phStack_18;
  int contains_shutdown_token;
  http_s *request_local;
  
  key._4_4_ = 0;
  phStack_18 = request;
  iVar1 = http_parse_body(request);
  if (iVar1 == 0) {
    local_28 = fiobj_str_new("token",5);
    sVar2 = fiobj_type_is(phStack_18->params,FIOBJ_T_HASH);
    if (sVar2 != 0) {
      FVar3 = fiobj_hash_get(phStack_18->params,local_28);
      if (FVar3 != 0) {
        FVar3 = fiobj_hash_get(phStack_18->params,local_28);
        fiobj_obj2cstr(&local_40,FVar3);
        __s2 = getenv("RSHUTDOWN_TOKEN");
        iVar1 = strcmp(local_40.data,__s2);
        if (iVar1 == 0) {
          key._4_4_ = 1;
        }
      }
    }
    fiobj_free(local_28);
    request_local._4_4_ = key._4_4_;
  }
  else {
    request_local._4_4_ = 0;
  }
  return request_local._4_4_;
}

Assistant:

int request_contains_shutdown_token(http_s *request) {
  int contains_shutdown_token = 0;

  if (http_parse_body(request) != 0) {
    return 0;
  }

  FIOBJ key = fiobj_str_new("token", 5);
  if (
    FIOBJ_TYPE_IS(request->params, FIOBJ_T_HASH)  /* check if JSON object is a hash, */
    && fiobj_hash_get(request->params, key)  /* test for existence of "token", */
    && !strcmp(fiobj_obj2cstr(fiobj_hash_get(request->params, key)).data,
        getenv("RSHUTDOWN_TOKEN"))  /* and test if token matches RSHUTDOWN_TOKEN */
  ) {
    contains_shutdown_token = 1;
  }
  fiobj_free(key);

  return contains_shutdown_token;
}